

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O1

void write_callback(void *context,cio_epoll_error error)

{
  cio_error cVar1;
  cio_socket *socket;
  
  cVar1 = CIO_SUCCESS;
  if (error != CIO_EPOLL_SUCCESS) {
    cVar1 = cio_linux_get_socket_error(*(int *)((long)context + 0x80));
  }
  (**(code **)((long)context + 0x38))
            (context,*(undefined8 *)((long)context + 0x40),*(undefined8 *)((long)context + 0x30),
             cVar1,0);
  return;
}

Assistant:

static void write_callback(void *context, enum cio_epoll_error error)
{
	struct cio_io_stream *stream = context;

	enum cio_error err = CIO_SUCCESS;

	if (cio_unlikely(error != CIO_EPOLL_SUCCESS)) {
		const struct cio_socket *socket = cio_const_container_of(stream, struct cio_socket, stream);
		err = cio_linux_get_socket_error(socket->impl.ev.fd);
	}

	stream->write_handler(stream, stream->write_handler_context, stream->write_buffer, err, 0);
}